

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

string * __thiscall
flatbuffers::GetAnyValueS_abi_cxx11_
          (string *__return_storage_ptr__,flatbuffers *this,BaseType type,uint8_t *data,
          Schema *schema,int type_index)

{
  uint uVar1;
  bool bVar2;
  uint16_t uVar3;
  BaseType BVar4;
  int64_t t;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_00;
  return_type this_01;
  String *pSVar5;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar6;
  Type *this_02;
  undefined4 in_register_00000014;
  uint *data_00;
  char *__s;
  Schema *schema_00;
  uint8_t *offset_location;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar7;
  Table *table;
  flatbuffers *this_03;
  double t_00;
  string val;
  string esc;
  
  data_00 = (uint *)CONCAT44(in_register_00000014,type);
  BVar4 = (BaseType)this;
  switch(BVar4) {
  case Float:
  case Double:
    t_00 = GetAnyValueF(BVar4,(uint8_t *)data_00);
    NumToString<double>(__return_storage_ptr__,t_00);
    return __return_storage_ptr__;
  case String:
    __s = (char *)((long)data_00 + (ulong)*data_00 + 4);
    break;
  case Vector:
    __s = "[(elements)]";
    break;
  case Obj:
    if (data != (uint8_t *)0x0) {
      schema_00 = schema;
      this_00 = reflection::Schema::objects((Schema *)data);
      this_01 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                          (this_00,(uint)schema);
      pSVar5 = reflection::Object::name(this_01);
      String::str_abi_cxx11_(__return_storage_ptr__,pSVar5);
      bVar2 = reflection::Object::is_struct(this_01);
      if (bVar2) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      uVar1 = *data_00;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pVVar6 = reflection::Object::fields(this_01);
      this_03 = (flatbuffers *)((long)data_00 + (ulong)uVar1);
      for (pVVar7 = pVVar6 + 4; pVVar7 != pVVar6 + 4 + (uint)(*(int *)pVVar6 << 2);
          pVVar7 = pVVar7 + 4) {
        table = (Table *)(pVVar7 + *(uint *)pVVar7);
        uVar3 = reflection::Field::offset((Field *)table);
        if ((uVar3 < *(ushort *)(this_03 + -(long)*(int *)this_03)) &&
           (*(short *)(this_03 + ((ulong)uVar3 - (long)*(int *)this_03)) != 0)) {
          GetAnyFieldS_abi_cxx11_(&val,this_03,table,(Field *)data,schema_00);
          this_02 = reflection::Field::type((Field *)table);
          BVar4 = reflection::Type::base_type(this_02);
          if (BVar4 == String) {
            esc._M_dataplus._M_p = (pointer)&esc.field_2;
            esc._M_string_length = 0;
            esc.field_2._M_local_buf[0] = '\0';
            schema_00 = (Schema *)0x0;
            EscapeString(val._M_dataplus._M_p,val._M_string_length,&esc,true,false);
            std::__cxx11::string::_M_assign((string *)&val);
            std::__cxx11::string::~string((string *)&esc);
          }
          pSVar5 = reflection::Field::name((Field *)table);
          String::str_abi_cxx11_(&esc,pSVar5);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&esc);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&val);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    __s = "(table)";
    break;
  case Union:
    __s = "(union)";
    break;
  default:
    t = GetAnyValueI(BVar4,(uint8_t *)data_00);
    NumToString<long>(__return_storage_ptr__,t);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&val);
  return __return_storage_ptr__;
}

Assistant:

std::string GetAnyValueS(reflection::BaseType type, const uint8_t *data,
                         const reflection::Schema *schema, int type_index) {
  switch (type) {
    case reflection::Float:
    case reflection::Double: return NumToString(GetAnyValueF(type, data));
    case reflection::String: {
      auto s =
          reinterpret_cast<const String *>(ReadScalar<uoffset_t>(data) + data);
      return s ? s->c_str() : "";
    }
    case reflection::Obj:
      if (schema) {
        // Convert the table to a string. This is mostly for debugging purposes,
        // and does NOT promise to be JSON compliant.
        // Also prefixes the type.
        auto &objectdef = *schema->objects()->Get(type_index);
        auto s = objectdef.name()->str();
        if (objectdef.is_struct()) {
          s += "(struct)";  // TODO: implement this as well.
        } else {
          auto table_field = reinterpret_cast<const Table *>(
              ReadScalar<uoffset_t>(data) + data);
          s += " { ";
          auto fielddefs = objectdef.fields();
          for (auto it = fielddefs->begin(); it != fielddefs->end(); ++it) {
            auto &fielddef = **it;
            if (!table_field->CheckField(fielddef.offset())) continue;
            auto val = GetAnyFieldS(*table_field, fielddef, schema);
            if (fielddef.type()->base_type() == reflection::String) {
              std::string esc;
              flatbuffers::EscapeString(val.c_str(), val.length(), &esc, true,
                                        false);
              val = esc;
            }
            s += fielddef.name()->str();
            s += ": ";
            s += val;
            s += ", ";
          }
          s += "}";
        }
        return s;
      } else {
        return "(table)";
      }
    case reflection::Vector:
      return "[(elements)]";                   // TODO: implement this as well.
    case reflection::Union: return "(union)";  // TODO: implement this as well.
    default: return NumToString(GetAnyValueI(type, data));
  }
}